

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall
CTcParser::finish_prop_expr
          (CTcParser *this,CTcPrsPropExprSave *save_info,CTcPrsNode **expr,CTPNCodeBody **cb,
          CTPNAnonFunc **inline_method,int is_static,int is_inline,CTcSymProp *prop_sym)

{
  undefined1 *puVar1;
  tctarg_prop_id_t tVar2;
  CTcPrsNode *pCVar3;
  int iVar4;
  CTPNStmBase *this_00;
  undefined **ppuVar5;
  CTPNCodeBody *pCVar6;
  CTPNAnonFunc *pCVar7;
  size_t siz;
  
  siz = (size_t)(uint)is_inline;
  *cb = (CTPNCodeBody *)0x0;
  *inline_method = (CTPNAnonFunc *)0x0;
  if ((*expr != (CTcPrsNode *)0x0) &&
     (((this->field_0x1e8 & 1) != 0 || (is_static == 0 && is_inline != 0)))) {
    if (is_static == 0) {
      iVar4 = (*((*expr)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[10])();
      this_00 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,siz);
      pCVar3 = *expr;
      if (iVar4 == 0) {
        CTPNStmBase::CTPNStmBase(this_00);
        this_00[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3
        ;
        ppuVar5 = &PTR_gen_code_0035e550;
      }
      else {
        CTPNStmBase::CTPNStmBase(this_00);
        this_00[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3
        ;
        ppuVar5 = &PTR_gen_code_00364390;
      }
      (this_00->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)ppuVar5;
    }
    else {
      this_00 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,siz);
      pCVar3 = *expr;
      tVar2 = (prop_sym->super_CTcSymPropBase).prop_;
      CTPNStmBase::CTPNStmBase(this_00);
      this_00[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
      *(tctarg_prop_id_t *)&this_00[1].next_stm_ = tVar2;
      (this_00->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_00364270;
    }
    pCVar6 = (CTPNCodeBody *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0xd8,siz);
    CTPNCodeBodyBase::CTPNCodeBodyBase
              ((CTPNCodeBodyBase *)pCVar6,this->local_symtab_,this->goto_symtab_,(CTPNStm *)this_00,
               0,0,0,0,(CTcSymLocal *)0x0,this->local_cnt_,this->self_valid_,
               save_info->cur_code_body_);
    (pCVar6->super_CTPNCodeBodyBase).super_CTPNStmTop.super_CTPNStm.super_CTPNStmBase.
    super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00364148;
    pCVar6->fin_ret_lcl_ = 0;
    pCVar6->field_0xd4 = pCVar6->field_0xd4 & 0xf8;
    pCVar6->first_nested_symtab_ = (CTcPrsSymtab *)0x0;
    pCVar6->named_arg_tables_ = (CTcNamedArgTab *)0x0;
    *cb = pCVar6;
    finish_local_ctx(this,pCVar6,this->local_symtab_);
    *(ushort *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 =
         (ushort)*(undefined4 *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 & 0xff7f |
         (ushort)((this->self_referenced_ & 1U) << 7);
    *(ushort *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 =
         (ushort)*(undefined4 *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 & 0xfeff |
         (ushort)((this->full_method_ctx_referenced_ & 1U) << 8);
    *(ushort *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 =
         (ushort)*(undefined4 *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 & 0xffef |
         (ushort)((this->local_ctx_needs_self_ & 1U) << 4);
    *(ushort *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 =
         (ushort)*(undefined4 *)&((*cb)->super_CTPNCodeBodyBase).field_0xb8 & 0xffdf |
         (ushort)((this->local_ctx_needs_full_method_ctx_ & 1U) << 5);
    if (is_inline != 0 && is_static == 0) {
      puVar1 = &((*cb)->super_CTPNCodeBodyBase).field_0xb8;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 0x400;
      pCVar6 = *cb;
      add_nested_stm(this,(CTPNStmTop *)pCVar6);
      pCVar7 = (CTPNAnonFunc *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)pCVar6);
      pCVar6 = *cb;
      iVar4 = (*((*expr)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[10])();
      (pCVar7->super_CTPNAnonFuncBase).code_body_ = pCVar6;
      (pCVar7->super_CTPNAnonFuncBase).field_0x10 =
           (pCVar7->super_CTPNAnonFuncBase).field_0x10 & 0xfc | (byte)iVar4 & 1 | 2;
      (pCVar7->super_CTPNAnonFuncBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_003651e8;
      *inline_method = pCVar7;
      *cb = (CTPNCodeBody *)0x0;
    }
  }
  this->field_0x1e8 = this->field_0x1e8 & 0xfe | *(byte *)save_info & 1;
  this->local_ctx_var_num_ = save_info->local_ctx_var_num_;
  this->ctx_var_props_used_ = save_info->ctx_var_props_used_;
  this->next_ctx_arr_idx_ = save_info->next_ctx_arr_idx_;
  this->local_cnt_ = save_info->local_cnt_;
  this->max_local_cnt_ = save_info->max_local_cnt_;
  this->cur_code_body_ = save_info->cur_code_body_;
  this->self_valid_ = save_info->self_valid_;
  this->self_referenced_ = save_info->self_referenced_;
  this->full_method_ctx_referenced_ = save_info->full_method_ctx_referenced_;
  this->local_ctx_needs_self_ = save_info->local_ctx_needs_self_;
  this->local_ctx_needs_full_method_ctx_ = save_info->local_ctx_needs_full_method_ctx_;
  this->enclosing_stm_ = save_info->enclosing_stm_;
  this->enclosing_local_symtab_ = save_info->enclosing_local_symtab_;
  this->local_symtab_ = save_info->local_symtab_;
  this->goto_symtab_ = save_info->goto_symtab_;
  if (is_static != 0 || is_inline == 0) {
    return;
  }
  CAnonFuncSymtabPrep::finish(&save_info->inline_prep_);
  return;
}

Assistant:

void CTcParser::finish_prop_expr(
    CTcPrsPropExprSave *save_info,
    CTcPrsNode* &expr, CTPNCodeBody* &cb, CTPNAnonFunc* &inline_method,
    int is_static, int is_inline, CTcSymProp *prop_sym)
{
    /* presume we won't need to create a code body or inline method */
    cb = 0;
    inline_method = 0;

    /* 
     *   If we have a local context, we have to set up a code body in order
     *   to initialize the local context at run-time.  If this is an inline
     *   object definition, and it's not a static property, we need to turn
     *   the expression into an anonymous method, so we also need to wrap it
     *   in a code body.
     */
    if (expr != 0
        && (has_local_ctx_
            || (is_inline && !is_static)))
    {
        /*   
         *   We need to wrap the expression in a code body to make the
         *   property into a method.  First, wrap the expression in an
         *   appropriate statement so that we can put it into a code body.
         */
        CTPNStm *stm;
        if (is_static)
        {
            /* 
             *   it's a static initializer - wrap it in a static initializer
             *   statement node 
             */
            stm = new CTPNStmStaticPropInit(expr, prop_sym->get_prop());
        }
        else if (expr->has_return_value())
        {
            /* normal property value - wrap it in a 'return' */
            stm = new CTPNStmReturn(expr);
        }
        else
        {
            /* 
             *   it's an expression that yields no value, such as a
             *   double-quoted string expression or a call to a void
             *   function; just use the expression itself 
             */
            stm = new CTPNStmExpr(expr);
        }
        
        /* wrap the expression statement in a code body */
        cb = new CTPNCodeBody(
            local_symtab_, goto_symtab_, stm, 0, 0, FALSE, FALSE, 0,
            local_cnt_, self_valid_, save_info->cur_code_body_);
        
        /* set up the local context for access to enclosing scope locals */
        finish_local_ctx(cb, local_symtab_);
        
        /* mark the code body for references to the method context */
        cb->set_self_referenced(self_referenced_);
        cb->set_full_method_ctx_referenced(full_method_ctx_referenced_);
        
        /* mark the code body for inclusion in any local context */
        cb->set_local_ctx_needs_self(local_ctx_needs_self_);
        cb->set_local_ctx_needs_full_method_ctx(
            local_ctx_needs_full_method_ctx_);
        
        /* 
         *   if this is a non-static property in an inline object
         *   definition, turn the expression into an anonymous method
         */
        if (is_inline && !is_static)
        {
            /* mark it as an anonymous method */
            cb->set_anon_method(TRUE);
            
            /* add the code body to the master list of nested functions */
            add_nested_stm(cb);
            
            /* wrap the code body in an anonymous method */
            inline_method = new CTPNAnonFunc(
                cb, expr->has_return_value(), TRUE);
            
            /* the anonymous method supersedes the code body */
            cb = 0;
        }
    }

    /* restore the saved parser state */
    has_local_ctx_ = save_info->has_local_ctx_;
    local_ctx_var_num_ = save_info->local_ctx_var_num_;
    ctx_var_props_used_ = save_info->ctx_var_props_used_;
    next_ctx_arr_idx_ = save_info->next_ctx_arr_idx_;
    local_cnt_ = save_info->local_cnt_;
    max_local_cnt_ = save_info->max_local_cnt_;
    cur_code_body_ = save_info->cur_code_body_;
    self_valid_ = save_info->self_valid_;
    self_referenced_ = save_info->self_referenced_;
    full_method_ctx_referenced_ = save_info->full_method_ctx_referenced_;
    local_ctx_needs_self_ = save_info->local_ctx_needs_self_;
    local_ctx_needs_full_method_ctx_ =
        save_info->local_ctx_needs_full_method_ctx_;
    enclosing_stm_ = save_info->enclosing_stm_;
    enclosing_local_symtab_ = save_info->enclosing_local_symtab_;
    local_symtab_ = save_info->local_symtab_;
    goto_symtab_ = save_info->goto_symtab_;

    /* 
     *   if this is a non-static property of an inline object, finish the
     *   anonymous method proxy symbol table for enclosing scopes 
     */
    if (is_inline && !is_static)
        save_info->inline_prep_.finish();
}